

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall message_unmatching_ids::test_method(message_unmatching_ids *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[39],_const_char_(&)[39]> local_1b8;
  assertion_result local_198;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170 [8];
  runtime_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]> local_e0;
  assertion_result local_c0;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  undefined1 local_68 [8];
  buffer_reader reader;
  nop_message nop;
  ping_message ping;
  undefined1 local_40 [8];
  buffer_writer writer;
  buffer buffer;
  message_unmatching_ids *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  buffer_writer::buffer_writer((buffer_writer *)local_40,(buffer *)&writer._start);
  ::operator<<((buffer_writer *)local_40,(ping_message *)((long)&reader._index + 3));
  buffer_reader::buffer_reader((buffer_reader *)local_68,(buffer *)&writer._start);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_88);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_78,0x8e,&local_88);
    ::operator>>((buffer_reader *)local_68,(nop_message *)((long)&reader._index + 1));
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_98,0x8e,&local_a8);
      boost::test_tools::assertion_result::assertion_result(&local_c0,false);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_e0,plVar3,
                 (char (*) [53])"exception std::runtime_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::test_tools::tt_detail::report_assertion
                (&local_c0,&local_e0.super_lazy_ostream,(const_string *)&ex,0x8e,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl(&local_e0);
      boost::test_tools::assertion_result::~assertion_result(&local_c0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    ::operator>>((buffer_reader *)local_68,(ping_message *)((long)&reader._index + 2));
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (local_170,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_170,0x8f,&local_180);
      boost::test_tools::assertion_result::assertion_result(&local_198,true);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_1b8,plVar3,(char (*) [39])"no exceptions thrown by reader >> ping");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
                 ,0x60);
      boost::test_tools::tt_detail::report_assertion
                (&local_198,&local_1b8.super_lazy_ostream,&local_1c8,0x8f,CHECK,CHECK_MSG,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[39],_const_char_(&)[39]>::
      ~lazy_ostream_impl(&local_1b8);
      boost::test_tools::assertion_result::~assertion_result(&local_198);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_unmatching_ids)
{
    buffer buffer;

    buffer_writer writer(buffer);
    writer << ping_message();

    ping_message ping;
    nop_message nop;
    buffer_reader reader(buffer);

    BOOST_CHECK_THROW(reader >> nop, std::runtime_error);
    BOOST_CHECK_NO_THROW(reader >> ping);
}